

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

void * chaiscript::detail::verify_type_no_throw<void>(Boxed_Value *ob,type_info *ti,void *ptr)

{
  bool bVar1;
  Type_Info *this;
  bad_any_cast *this_00;
  void *ptr_local;
  type_info *ti_local;
  Boxed_Value *ob_local;
  
  bVar1 = Boxed_Value::is_const(ob);
  if (!bVar1) {
    this = Boxed_Value::get_type_info(ob);
    bVar1 = Type_Info::operator==(this,ti);
    if (bVar1) {
      return ptr;
    }
  }
  this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
  memset(this_00,0,8);
  exception::bad_any_cast::bad_any_cast(this_00);
  __cxa_throw(this_00,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static T *verify_type_no_throw(const Boxed_Value &ob, const std::type_info &ti, T *ptr) {
      if (!ob.is_const() && ob.get_type_info() == ti) {
        return ptr;
      } else {
        throw chaiscript::detail::exception::bad_any_cast();
      }
    }